

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.cc
# Opt level: O3

void __thiscall
VW::config::options_boost_po::add_and_parse(options_boost_po *this,option_group_definition *group)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__n;
  int iVar4;
  mapped_type *pmVar5;
  pointer psVar6;
  pointer __v;
  pointer pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v_00;
  shared_ptr<VW::config::base_option> opt_ptr;
  basic_parsed_options<char> parsed_options;
  options_description new_options;
  variables_map vm;
  shared_ptr<VW::config::base_option> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_368;
  option_group_definition *local_360;
  undefined1 local_358 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_350;
  undefined1 local_348 [64];
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_308 [32];
  undefined1 local_2e8 [8];
  basic_parsed_options<char> local_2e0;
  undefined1 local_2b8 [40];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_290 [24];
  void *local_278;
  undefined4 local_270;
  undefined8 local_268;
  undefined4 local_260;
  undefined8 local_258;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_250 [152];
  undefined1 local_1b8 [64];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_148 [5];
  
  boost::program_options::options_description::options_description
            ((options_description *)local_2b8,(string *)group,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  psVar6 = (group->m_options).
           super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (group->m_options).
           super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_360 = group;
  if (psVar6 != psVar1) {
    this_00 = &this->m_defined_options;
    do {
      local_378.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar6->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_350._M_pi =
           (psVar6->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_350._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_378.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_350._M_pi)->_M_use_count = (local_350._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_350._M_pi)->_M_use_count = (local_350._M_pi)->_M_use_count + 1;
        }
        local_378.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = local_350._M_pi;
        if (local_350._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_350._M_pi)->_M_use_count = (local_350._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_350._M_pi)->_M_use_count = (local_350._M_pi)->_M_use_count + 1;
          }
        }
      }
      local_358 = (undefined1  [8])
                  local_378.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
      add_to_description(this,&local_378,(options_description *)local_2b8);
      if (local_378.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_378.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)local_358 + 8));
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)local_358 + 0x50));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     "-",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)local_358 + 0x50));
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_);
      }
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VW::config::base_option>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VW::config::base_option>_>_>_>
               ::operator[](&this->m_options,(key_type *)((long)local_358 + 8));
      (pmVar5->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)local_358;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar5->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount,&local_350);
      if (local_350._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_350._M_pi);
      }
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar1);
  }
  boost::program_options::options_description::print((ostream *)local_2b8,(int)this + 0x60);
  boost::program_options::variables_map::variables_map((variables_map *)local_1b8);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_358,&this->m_command_line);
  boost::program_options::detail::cmdline::set_options_description((options_description *)local_358)
  ;
  local_2e8 = (undefined1  [8])local_2b8;
  boost::program_options::detail::cmdline::style((int)local_358);
  boost::program_options::detail::cmdline::allow_unregistered();
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)(local_2e8 + 8),
             (basic_command_line_parser<char> *)local_358);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(local_308);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)(local_348 + 0x20));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_358);
  if (local_2e0.options.
      super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2e0.options.
      super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_368 = &(local_2e0.options.
                  super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->string_key;
    __v = local_2e0.options.
          super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    pbVar7 = local_2e0.options.
             super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->m_supplied_options,&__v->string_key);
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)__v + 0x20))->field_2)._M_allocated_capacity;
      for (__v_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)__v + 0x20))->_M_string_length; __v_00 != pbVar2; __v_00 = __v_00 + 1) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&this->m_ignore_supplied,__v_00);
      }
      if (((__v->string_key)._M_string_length != 0) && (*(__v->string_key)._M_dataplus._M_p == '-'))
      {
        std::__cxx11::string::substr((ulong)local_358,(ulong)__v);
        psVar1 = (local_360->m_options).
                 super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (psVar6 = (local_360->m_options).
                      super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar7 = (pointer)local_368,
            psVar6 != psVar1; psVar6 = psVar6 + 1) {
          peVar3 = (psVar6->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr;
          this_01 = (psVar6->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount._M_pi;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
          }
          __n = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (peVar3->m_short_name)._M_string_length;
          if (__n == local_350._M_pi) {
            if (__n != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              iVar4 = bcmp((peVar3->m_short_name)._M_dataplus._M_p,(void *)local_358,(size_t)__n);
              if (iVar4 != 0) goto LAB_00211ffd;
            }
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->m_supplied_options,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_358);
          }
LAB_00211ffd:
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
        }
        if (local_358 != (undefined1  [8])local_348) {
          operator_delete((void *)local_358);
        }
      }
      __v = (pointer)((long)__v + 0x60);
    } while (__v != pbVar7);
  }
  boost::program_options::store
            ((basic_parsed_options *)(local_2e8 + 8),(variables_map *)local_1b8,false);
  boost::program_options::notify((variables_map *)local_1b8);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)(local_2e8 + 8));
  local_1b8._0_8_ = std::__cxx11::istringstream::istringstream;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_148);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_178);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               *)(local_1b8 + 0x10));
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_250);
  if (local_278 != (void *)0x0) {
    operator_delete(local_278);
    local_278 = (void *)0x0;
    local_270 = 0;
    local_268 = 0;
    local_260 = 0;
    local_258 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_290);
  if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
    operator_delete((void *)local_2b8._0_8_);
  }
  return;
}

Assistant:

void options_boost_po::add_and_parse(const option_group_definition& group)
{
  po::options_description new_options(group.m_name);

  for (auto opt_ptr : group.m_options)
  {
    add_to_description(opt_ptr, new_options);
    m_defined_options.insert(opt_ptr->m_name);
    m_defined_options.insert(opt_ptr->m_short_name);
    m_defined_options.insert("-" + opt_ptr->m_short_name);

    // The last definition is kept. There was a bug where using .insert at a later pointer changed the command line but
    // the previously defined option's default value was serialized into the model. This resolves that state info.
    m_options[opt_ptr->m_name] = opt_ptr;
  }

  // Add the help for the given options.
  new_options.print(m_help_stringstream);

  try
  {
    po::variables_map vm;
    auto parsed_options = po::command_line_parser(m_command_line)
                              .options(new_options)
                              .style(po::command_line_style::default_style ^ po::command_line_style::allow_guessing)
                              .allow_unregistered()
                              .run();

    for (auto const& option : parsed_options.options)
    {
      m_supplied_options.insert(option.string_key);

      // If a string is later determined to be a value the erase it. This happens for negative numbers "-2"
      for (auto& val : option.value)
      {
        m_ignore_supplied.insert(val);
      }

      // Parsed options can contain short options in the form -k, we can only check these as the group definitions come
      // in.
      if (option.string_key.length() > 0 && option.string_key[0] == '-')
      {
        auto short_name = option.string_key.substr(1);
        for (auto opt_ptr : group.m_options)
        {
          if (opt_ptr->m_short_name == short_name)
          {
            m_supplied_options.insert(short_name);
          }
        }
      }
    }

    po::store(parsed_options, vm);
    po::notify(vm);
  }
  catch (boost::exception_detail::clone_impl<
      boost::exception_detail::error_info_injector<boost::program_options::invalid_option_value>>& ex)
  {
    THROW_EX(VW::vw_argument_invalid_value_exception, ex.what());
  }
  catch (boost::exception_detail::clone_impl<boost::exception_detail::error_info_injector<boost::bad_lexical_cast>>& ex)
  {
    THROW_EX(VW::vw_argument_invalid_value_exception, ex.what());
  }
  catch (boost::exception_detail::clone_impl<
      boost::exception_detail::error_info_injector<boost::program_options::ambiguous_option>>& ex)
  {
    THROW(ex.what());
  }
  catch (boost::program_options::ambiguous_option &ex)
  {
    THROW(ex.what());
  }
}